

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void * op_url_stream_vcreate(OpusFileCallbacks *_cb,char *_url,__va_list_tag *_ap)

{
  void *pvVar1;
  void *ret;
  OpusServerInfo *pinfo;
  OpusServerInfo info;
  __va_list_tag *_ap_local;
  char *_url_local;
  OpusFileCallbacks *_cb_local;
  
  info._56_8_ = _ap;
  pvVar1 = op_url_stream_vcreate_impl(_cb,_url,(OpusServerInfo *)&pinfo,(OpusServerInfo **)&ret,_ap)
  ;
  if (ret != (void *)0x0) {
    memcpy(ret,&pinfo,0x40);
  }
  return pvVar1;
}

Assistant:

void *op_url_stream_vcreate(OpusFileCallbacks *_cb,
 const char *_url,va_list _ap){
  OpusServerInfo   info;
  OpusServerInfo *pinfo;
  void *ret;
  ret=op_url_stream_vcreate_impl(_cb,_url,&info,&pinfo,_ap);
  if(pinfo!=NULL)*pinfo=*&info;
  return ret;
}